

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.h
# Opt level: O0

void __thiscall sznet::Logger::SourceFile::SourceFile<105>(SourceFile *this,char (*arr) [105])

{
  char *pcVar1;
  char *slash;
  char (*arr_local) [105];
  SourceFile *this_local;
  
  this->m_data = *arr;
  this->m_size = 0x68;
  pcVar1 = strrchr(this->m_data,0x2f);
  if (pcVar1 != (char *)0x0) {
    this->m_data = pcVar1 + 1;
    this->m_size = this->m_size - ((int)this->m_data - (int)arr);
  }
  return;
}

Assistant:

SourceFile(const char(&arr)[N]): 
			m_data(arr),
			m_size(N - 1)
		{
#if defined(SZ_OS_WINDOWS)
			const char* slash = strrchr(m_data, '\\');
#else
			const char* slash = strrchr(m_data, '/');
#endif
			if (slash)
			{
				m_data = slash + 1;
				m_size -= static_cast<int>(m_data - arr);
			}
		}